

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

VariableData *
anon_unknown.dwarf_6f1cc::AllocateTemporary(ExpressionContext *ctx,SynBase *source,TypeBase *type)

{
  uint uVar1;
  uint uniqueId;
  Allocator *allocator;
  ScopeData *scope;
  bool bVar2;
  VariableData *this;
  SynIdentifier *this_00;
  InplaceStr name_00;
  VariableData *variable;
  InplaceStr name;
  TypeBase *type_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  uVar1 = ctx->unnamedVariableCount;
  ctx->unnamedVariableCount = uVar1 + 1;
  name_00 = GetTemporaryName(ctx,uVar1,(char *)0x0);
  if (((type->isGeneric ^ 0xffU) & 1) != 0) {
    this = ExpressionContext::get<VariableData>(ctx);
    allocator = ctx->allocator;
    scope = ctx->scope;
    uVar1 = type->alignment;
    this_00 = ExpressionContext::get<SynIdentifier>(ctx);
    SynIdentifier::SynIdentifier(this_00,name_00);
    uniqueId = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uniqueId + 1;
    VariableData::VariableData(this,allocator,source,scope,uVar1,type,this_00,0,uniqueId);
    bVar2 = IsLookupOnlyVariable(ctx,this);
    if (bVar2) {
      this->lookupOnly = true;
    }
    this->isAlloca = true;
    this->offset = 0xffffffff;
    ExpressionContext::AddVariable(ctx,this,false);
    return this;
  }
  __assert_fail("!type->isGeneric",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x348,
                "VariableData *(anonymous namespace)::AllocateTemporary(ExpressionContext &, SynBase *, TypeBase *)"
               );
}

Assistant:

VariableData* AllocateTemporary(ExpressionContext &ctx, SynBase *source, TypeBase *type)
	{
		InplaceStr name = GetTemporaryName(ctx, ctx.unnamedVariableCount++, NULL);

		assert(!type->isGeneric);

		VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, type->alignment, type, new (ctx.get<SynIdentifier>()) SynIdentifier(name), 0, ctx.uniqueVariableId++);

		if (IsLookupOnlyVariable(ctx, variable))
			variable->lookupOnly = true;

		variable->isAlloca = true;
		variable->offset = ~0u;

		ctx.AddVariable(variable, false);

		return variable;
	}